

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O2

bool testing::internal::ParseGoogleMockBoolFlag(char *str,char *flag,bool *value)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = ParseGoogleMockFlagValue(str,"catch_leaked_mocks",true);
  if (pcVar2 != (char *)0x0) {
    cVar1 = *pcVar2;
    FLAGS_gmock_catch_leaked_mocks = 0;
    if ((cVar1 != '0') && (FLAGS_gmock_catch_leaked_mocks = 0, cVar1 != 'f')) {
      FLAGS_gmock_catch_leaked_mocks = cVar1 != 'F';
    }
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

static bool ParseGoogleMockBoolFlag(const char* str, const char* flag,
                                    bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag, true);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}